

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorOr.h
# Opt level: O0

void __thiscall
llvm::ErrorOr<std::__cxx11::string>::moveConstruct<std::__cxx11::string>
          (ErrorOr<std::__cxx11::string> *this,
          ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Other)

{
  storage_type *this_00;
  storage_type *psVar1;
  error_code *peVar2;
  error_code eVar3;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *Other_local;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if ((Other->field_0x20 & 1) == 0) {
    this[0x20] = (ErrorOr<std::__cxx11::string>)((byte)this[0x20] & 0xfe);
    this_00 = ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::getStorage((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this);
    psVar1 = ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getStorage(Other);
    std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  }
  else {
    this[0x20] = (ErrorOr<std::__cxx11::string>)((byte)this[0x20] & 0xfe | 1);
    peVar2 = ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getErrorStorage((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)this);
    eVar3 = ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getError(Other);
    peVar2->_M_value = eVar3._M_value;
    peVar2->_M_cat = eVar3._M_cat;
  }
  return;
}

Assistant:

void moveConstruct(ErrorOr<OtherT> &&Other) {
    if (!Other.HasError) {
      // Get the other value.
      HasError = false;
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    } else {
      // Get other's error.
      HasError = true;
      new (getErrorStorage()) std::error_code(Other.getError());
    }
  }